

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O2

int IDASetQuadErrCon(void *ida_mem,int errconQ)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    error_code = -0x14;
    line = 0x37d;
  }
  else {
    if (*(int *)((long)ida_mem + 0x6a8) != 0) {
      *(int *)((long)ida_mem + 0x78) = errconQ;
      return 0;
    }
    msgfmt = "Illegal attempt to call before calling IDAQuadInit.";
    error_code = -0x1e;
    line = 900;
  }
  IDAProcessError((IDAMem)0x0,error_code,line,"IDASetQuadErrCon",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDASetQuadErrCon(void* ida_mem, sunbooleantype errconQ)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_quadMallocDone == SUNFALSE)
  {
    IDAProcessError(NULL, IDA_NO_QUAD, __LINE__, __func__, __FILE__, MSG_NO_QUAD);
    return (IDA_NO_QUAD);
  }

  IDA_mem->ida_errconQ = errconQ;

  return (IDA_SUCCESS);
}